

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O0

void UI::PathTracerRightStatus(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ImGuiStyle *pIVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  ImVec2 IVar9;
  double dVar10;
  char buf [128];
  float spacing;
  float indent_w;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  char *__s;
  float in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined1 uVar11;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  char *__s_00;
  float local_c0;
  float local_b8;
  float local_b0;
  float local_a8;
  float local_a0;
  char local_98 [136];
  float local_10;
  float local_c;
  
  uVar11 = (undefined1)((uint)in_stack_ffffffffffffff1c >> 0x18);
  local_c = ImGui::GetWindowContentRegionWidth();
  pIVar5 = ImGui::GetStyle();
  local_10 = (pIVar5->ItemSpacing).x;
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1885dd);
  uVar2 = PathTracerThread::GetSPP(peVar6);
  in_stack_ffffffffffffff24 = in_stack_ffffffffffffff24 & 0xffffff;
  __s_00 = local_98;
  sprintf(__s_00,"SPP %u",(ulong)uVar2);
  IVar9 = ImGui::CalcTextSize(__s_00,(char *)CONCAT44(in_stack_ffffffffffffff24,
                                                      in_stack_ffffffffffffff20),(bool)uVar11,
                              in_stack_ffffffffffffff18);
  local_a0 = IVar9.x;
  local_c = local_c - local_a0;
  ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                  SUB84(in_stack_ffffffffffffff00,0));
  ImGui::TextUnformatted
            (in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_c = local_c - local_10;
  ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                  SUB84(in_stack_ffffffffffffff00,0));
  ImGui::Separator();
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1886b4);
  PathTracerThread::GetPathTracerViewerPtr(peVar6);
  peVar7 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1886c4);
  PathTracerViewer::GetPathTracerPtr(peVar7);
  peVar8 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1886d4);
  uVar2 = peVar8->m_width;
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1886eb);
  PathTracerThread::GetPathTracerViewerPtr(peVar6);
  peVar7 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1886fb);
  PathTracerViewer::GetPathTracerPtr(peVar7);
  peVar8 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x18870b);
  sprintf(__s_00,anon_var_dwarf_1dc219,(ulong)uVar2,(ulong)peVar8->m_height);
  IVar9 = ImGui::CalcTextSize(__s_00,(char *)CONCAT44(in_stack_ffffffffffffff24,uVar2),(bool)uVar11,
                              in_stack_ffffffffffffff18);
  local_a8 = IVar9.x;
  local_c = local_c - (local_a8 + local_10);
  ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                  SUB84(in_stack_ffffffffffffff00,0));
  ImGui::TextUnformatted
            (in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffff00);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImGui::EndTooltip();
  }
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1887c9);
  PathTracerThread::GetPathTracerViewerPtr(peVar6);
  peVar7 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1887d9);
  PathTracerViewer::GetPathTracerPtr(peVar7);
  peVar8 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1887e9);
  uVar11 = false;
  sprintf(local_98,anon_var_dwarf_1dc245,(ulong)peVar8->m_bounce);
  IVar9 = ImGui::CalcTextSize(__s_00,(char *)CONCAT44(in_stack_ffffffffffffff24,uVar2),(bool)uVar11,
                              in_stack_ffffffffffffff18);
  local_b0 = IVar9.x;
  local_c = local_c - (local_b0 + local_10);
  ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                  SUB84(in_stack_ffffffffffffff00,0));
  ImGui::TextUnformatted
            (in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffff00);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImGui::EndTooltip();
  }
  std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1888a6);
  dVar10 = PathTracerThread::GetRenderTime
                     ((PathTracerThread *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  __s = local_98;
  sprintf(__s,anon_var_dwarf_1dc259,(long)dVar10 & 0xffffffff);
  IVar9 = ImGui::CalcTextSize(__s_00,(char *)CONCAT44(in_stack_ffffffffffffff24,uVar2),(bool)uVar11,
                              in_stack_ffffffffffffff18);
  local_b8 = IVar9.x;
  local_c = local_c - (local_b8 + local_10);
  ImGui::SameLine((float)((ulong)__s >> 0x20),SUB84(__s,0));
  ImGui::TextUnformatted(__s,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)__s);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted
              (__s,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ImGui::EndTooltip();
  }
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18896c);
  PathTracerThread::GetPathTracerQueue(peVar6);
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x18897c)
  ;
  uVar3 = myvk::Queue::GetFamilyIndex((Queue *)0x188984);
  peVar6 = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x188995);
  PathTracerThread::GetMainQueue(peVar6);
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1889a5)
  ;
  uVar4 = myvk::Queue::GetFamilyIndex((Queue *)0x1889ad);
  if (uVar3 == uVar4) {
    IVar9 = ImGui::CalcTextSize(__s_00,(char *)CONCAT44(in_stack_ffffffffffffff24,uVar2),
                                (bool)uVar11,in_stack_ffffffffffffff18);
    local_c0 = IVar9.x;
    local_c = local_c - (local_c0 + local_10);
    ImGui::SameLine((float)((ulong)__s >> 0x20),SUB84(__s,0));
    ImGui::TextUnformatted(__s,(char *)CONCAT44(uVar3,in_stack_fffffffffffffef8));
    bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)__s);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::TextUnformatted(__s,(char *)CONCAT44(uVar3,in_stack_fffffffffffffef8));
      ImGui::EndTooltip();
    }
  }
  return;
}

Assistant:

void PathTracerRightStatus(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	float indent_w = ImGui::GetWindowContentRegionWidth(), spacing = ImGui::GetStyle().ItemSpacing.x;
	char buf[128];

	sprintf(buf, "SPP %u", path_tracer_thread->GetSPP());
	indent_w -= ImGui::CalcTextSize(buf).x;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	indent_w -= spacing;
	ImGui::SameLine(indent_w);
	ImGui::Separator();

	sprintf(buf, ICON_FA_IMAGE " %ux%u", path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_width,
	        path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_height);
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Resolution");
		ImGui::EndTooltip();
	}

	sprintf(buf, ICON_FA_BOLT " %u", path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_bounce);
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Bounce");
		ImGui::EndTooltip();
	}

	sprintf(buf, ICON_FA_STOPWATCH " %u sec", uint32_t(path_tracer_thread->GetRenderTime()));
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Render Time");
		ImGui::EndTooltip();
	}

	if (path_tracer_thread->GetPathTracerQueue()->GetFamilyIndex() ==
	    path_tracer_thread->GetMainQueue()->GetFamilyIndex()) {
		indent_w -= ImGui::CalcTextSize(ICON_FA_EXCLAMATION_TRIANGLE).x + spacing;
		ImGui::SameLine(indent_w);
		ImGui::TextUnformatted(ICON_FA_EXCLAMATION_TRIANGLE);

		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Async path tracing queue not available");
			ImGui::EndTooltip();
		}
	}
}